

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,int iCursor,int isLeftJoin)

{
  int iVar1;
  Expr *pEVar2;
  ulong uVar3;
  int iVar4;
  SubstContext x;
  Walker local_60;
  
  iVar1 = 0;
  if ((((pWhere != (Expr *)0x0) && ((pSubq->selFlags & 0x2000) == 0)) &&
      (iVar1 = 0, pSubq->pWin == (Window *)0x0)) && (pSubq->pLimit == (Expr *)0x0)) {
    iVar4 = 0;
    if (pWhere->op == ',') {
      iVar4 = 0;
      do {
        iVar1 = pushDownWhereTerms(pParse,pSubq,pWhere->pRight,iCursor,isLeftJoin);
        iVar4 = iVar4 + iVar1;
        pWhere = pWhere->pLeft;
      } while (pWhere->op == ',');
    }
    if (((isLeftJoin == 0) ||
        ((iVar1 = 0, (pWhere->flags & 1) != 0 && (pWhere->iRightJoinTable == iCursor)))) &&
       (((pWhere->flags & 1) == 0 || (iVar1 = 0, pWhere->iRightJoinTable == iCursor)))) {
      local_60.eCode = '\x03';
      local_60.xExprCallback = exprNodeIsConstant;
      local_60.xSelectCallback = sqlite3SelectWalkFail;
      local_60.u.n = iCursor;
      walkExpr(&local_60,pWhere);
      iVar1 = iVar4;
      if (local_60.eCode != '\0') {
        iVar1 = iVar4 + 1;
        for (; pSubq != (Select *)0x0; pSubq = pSubq->pPrior) {
          pEVar2 = exprDup(pParse->db,pWhere,0,(u8 **)0x0);
          unsetJoinExpr(pEVar2,-1);
          local_60.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)CONCAT44(iCursor,iCursor);
          local_60.xSelectCallback =
               (_func_int_Walker_ptr_Select_ptr *)
               ((ulong)local_60.xSelectCallback & 0xffffffff00000000);
          local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)pSubq->pEList;
          local_60.pParse = pParse;
          pEVar2 = substExpr((SubstContext *)&local_60,pEVar2);
          uVar3 = (ulong)(pSubq->selFlags & 8);
          pEVar2 = sqlite3ExprAnd(pParse->db,
                                  *(Expr **)((long)pSubq->addrOpenEphm + uVar3 * 2 + 0x14),pEVar2);
          *(Expr **)((long)pSubq->addrOpenEphm + uVar3 * 2 + 0x14) = pEVar2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  int iCursor,          /* Cursor number of the subquery */
  int isLeftJoin        /* True if pSubq is the right term of a LEFT JOIN */
){
  Expr *pNew;
  int nChng = 0;
  if( pWhere==0 ) return 0;
  if( pSubq->selFlags & SF_Recursive ) return 0;  /* restriction (2) */

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( pSubq->pWin ) return 0;    /* restriction (6) */
#endif

#ifdef SQLITE_DEBUG
  /* Only the first term of a compound can have a WITH clause.  But make
  ** sure no other terms are marked SF_Recursive in case something changes
  ** in the future.
  */
  {
    Select *pX;  
    for(pX=pSubq; pX; pX=pX->pPrior){
      assert( (pX->selFlags & (SF_Recursive))==0 );
    }
  }
#endif

  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight,
                                iCursor, isLeftJoin);
    pWhere = pWhere->pLeft;
  }
  if( isLeftJoin
   && (ExprHasProperty(pWhere,EP_FromJoin)==0
         || pWhere->iRightJoinTable!=iCursor)
  ){
    return 0; /* restriction (4) */
  }
  if( ExprHasProperty(pWhere,EP_FromJoin) && pWhere->iRightJoinTable!=iCursor ){
    return 0; /* restriction (5) */
  }
  if( sqlite3ExprIsTableConstant(pWhere, iCursor) ){
    nChng++;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      unsetJoinExpr(pNew, -1);
      x.pParse = pParse;
      x.iTable = iCursor;
      x.iNewTable = iCursor;
      x.isLeftJoin = 0;
      x.pEList = pSubq->pEList;
      pNew = substExpr(&x, pNew);
      if( pSubq->selFlags & SF_Aggregate ){
        pSubq->pHaving = sqlite3ExprAnd(pParse->db, pSubq->pHaving, pNew);
      }else{
        pSubq->pWhere = sqlite3ExprAnd(pParse->db, pSubq->pWhere, pNew);
      }
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}